

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

sysbvm_tuple_t sysbvm_context_shallowCopy(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  size_t sVar1;
  
  if ((tuple & 0xf) == 0 && tuple != 0) {
    tuple = (sysbvm_tuple_t)
            sysbvm_heap_shallowCopyTuple(&context->heap,(sysbvm_object_tuple_t *)tuple);
    sVar1 = (context->identityHashSeed * 0x41c64e6d & 0x7ffffffffffffff) + 0x3039;
    context->identityHashSeed = sVar1;
    (((sysbvm_object_tuple_t *)tuple)->header).identityHashAndFlags =
         (int)sVar1 << 10 | (((sysbvm_object_tuple_t *)tuple)->header).identityHashAndFlags & 0x3ff;
  }
  return tuple;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_shallowCopy(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    if(!sysbvm_tuple_isNonNullPointer(tuple))
        return tuple;

    sysbvm_object_tuple_t *result = sysbvm_heap_shallowCopyTuple(&context->heap, (sysbvm_object_tuple_t*)tuple);
    sysbvm_tuple_setIdentityHash(result, sysbvm_context_generateIdentityHash(context));
    return (sysbvm_tuple_t)result;    
}